

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsMipAnalysis.cpp
# Opt level: O1

void __thiscall HighsMipAnalysis::reportMipTimer(HighsMipAnalysis *this)

{
  HighsTimerClock *mip_timer_clock;
  pointer pcVar1;
  MipTimer mip_timer;
  MipTimer local_69;
  string local_68;
  string local_48;
  
  if (this->analyse_mip_time == true) {
    mip_timer_clock = &this->mip_clocks;
    MipTimer::reportMipCoreClock(&local_69,mip_timer_clock);
    MipTimer::reportMipLevel1Clock(&local_69,mip_timer_clock);
    MipTimer::reportMipEvaluateRootNodeClock(&local_69,mip_timer_clock);
    MipTimer::reportMipSolveLpClock(&local_69,mip_timer_clock);
    pcVar1 = (this->model_name)._M_dataplus._M_p;
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_48,pcVar1,pcVar1 + (this->model_name)._M_string_length);
    MipTimer::csvEvaluateRootNodeClock(&local_69,&local_48,mip_timer_clock,true,true);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p);
    }
    pcVar1 = (this->model_name)._M_dataplus._M_p;
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_68,pcVar1,pcVar1 + (this->model_name)._M_string_length);
    MipTimer::csvEvaluateRootNodeClock(&local_69,&local_68,mip_timer_clock,false,true);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p);
    }
  }
  return;
}

Assistant:

void HighsMipAnalysis::reportMipTimer() {
  if (!analyse_mip_time) return;
  MipTimer mip_timer;
  mip_timer.reportMipCoreClock(mip_clocks);
  mip_timer.reportMipLevel1Clock(mip_clocks);
  mip_timer.reportMipEvaluateRootNodeClock(mip_clocks);
  //  mip_timer.reportAltEvaluateRootNodeClock(mip_clocks);
  //  mip_timer.reportMipPresolveClock(mip_clocks);
  //  mip_timer.reportMipSeparationClock(mip_clocks);
  //  mip_timer.reportMipSearchClock(mip_clocks);
  //  mip_timer.reportMipDiveClock(mip_clocks);
  //  mip_timer.reportMipNodeSearchClock(mip_clocks);
  //  mip_timer.reportMipDivePrimalHeuristicsClock(mip_clocks);
  //  mip_timer.reportMipSubMipSolveClock(mip_clocks);
  mip_timer.reportMipSolveLpClock(mip_clocks);
  //  mip_timer.csvMipClock(this->model_name, mip_clocks, true, false);
  //  reportMipSolveLpClock(true);
  //  mip_timer.csvMipClock(this->model_name, mip_clocks, false, false);
  //  reportMipSolveLpClock(false);
  mip_timer.csvEvaluateRootNodeClock(this->model_name, mip_clocks, true, true);
  mip_timer.csvEvaluateRootNodeClock(this->model_name, mip_clocks, false, true);
  //  analyseVectorValues(nullptr, "Node search time",
  //                      HighsInt(node_search_time.size()), node_search_time);
  //  analyseVectorValues(nullptr, "Dive time", HighsInt(dive_time.size()),
  //                      dive_time);
}